

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::i2p_stream::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,endpoint_type *param_1,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  tuple<libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  *ptVar1;
  size_t sVar2;
  query q;
  _Any_data local_e8;
  _Manager_type local_d8;
  _Invoker_type p_Stack_d0;
  _Bind<void_(libtorrent::i2p_stream::*(libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::function<void_(const_boost::system::error_code_&)>)>
  local_c8;
  basic_resolver_query<boost::asio::ip::tcp> local_90;
  
  to_string((array<char,_22UL> *)&local_e8,(long)(this->super_proxy_base).m_port);
  ptVar1 = &local_c8._M_bound_args;
  local_c8._M_f = (offset_in_i2p_stream_to_subr)ptVar1;
  sVar2 = strlen(local_e8._M_pod_data);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,&local_e8,local_e8._M_pod_data + sVar2);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            (&local_90,&(this->super_proxy_base).m_hostname,(string *)&local_c8,address_configured);
  if ((tuple<libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
       *)local_c8._M_f != ptVar1) {
    operator_delete((void *)local_c8._M_f,
                    local_c8._M_bound_args.
                    super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>
                    ._M_head_impl.super__Function_base._M_functor._M_unused._M_member_pointer + 1);
  }
  std::function<void(boost::system::error_code_const&)>::
  function<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>const,void>
            ((function<void(boost::system::error_code_const&)> *)local_e8._M_pod_data,handler);
  local_c8._M_f = (offset_in_i2p_stream_to_subr)do_connect;
  local_c8._8_8_ = 0;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_functor._8_8_ = 0;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_manager = (_Manager_type)0x0;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  ._M_invoker = p_Stack_d0;
  if (local_d8 != (_Manager_type)0x0) {
    local_c8._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._M_unused._M_object = local_e8._M_unused._M_object;
    local_c8._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._8_8_ = local_e8._8_8_;
    local_c8._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_manager = local_d8;
    local_d8 = (_Manager_type)0x0;
    p_Stack_d0 = (_Invoker_type)0x0;
  }
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Head_base<0UL,_libtorrent::i2p_stream_*,_false>._M_head_impl = this;
  boost::asio::detail::resolver_service<boost::asio::ip::tcp>::
  async_resolve<std::_Bind<void(libtorrent::i2p_stream::*(libtorrent::i2p_stream*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&)>)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ((this->super_proxy_base).m_resolver.impl_.service_,
             &(this->super_proxy_base).m_resolver.impl_.implementation_,&local_90,&local_c8,
             &(this->super_proxy_base).m_resolver.impl_.executor_);
  if (local_c8._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_manager)
              ((_Any_data *)ptVar1,(_Any_data *)ptVar1,__destroy_functor);
  }
  if (local_d8 != (_Manager_type)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.service_name_._M_dataplus._M_p != &local_90.service_name_.field_2) {
    operator_delete(local_90.service_name_._M_dataplus._M_p,
                    local_90.service_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.host_name_._M_dataplus._M_p != &local_90.host_name_.field_2) {
    operator_delete(local_90.host_name_._M_dataplus._M_p,
                    local_90.host_name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void async_connect(endpoint_type const&, Handler const& handler)
	{
		// since we don't support regular endpoints, just ignore the one
		// provided and use m_dest.

		// the connect is split up in the following steps:
		// 1. resolve name of proxy server
		// 2. connect to SAM bridge
		// 4 send command message (CONNECT/ACCEPT)

		using std::placeholders::_1;
		using std::placeholders::_2;
		tcp::resolver::query q(m_hostname, to_string(m_port).data());
		m_resolver.async_resolve(q, std::bind(
			&i2p_stream::do_connect, this, _1, _2, handler_type(std::move(handler))));
	}